

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

EbmlElement * __thiscall libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt)

{
  pointer ppEVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  pointer ppEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppEVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  ppEVar6 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar5 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)ppEVar5 - (long)ppEVar6 >> 3;
  uVar8 = 0;
  do {
    uVar9 = uVar7;
    if (uVar7 == uVar8) break;
    uVar9 = uVar8 + 1;
    ppEVar1 = ppEVar6 + uVar8;
    uVar8 = uVar9;
  } while (*ppEVar1 != PastElt);
  while( true ) {
    if ((ulong)((long)ppEVar5 - (long)ppEVar6 >> 3) <= uVar9) {
      return (EbmlElement *)0x0;
    }
    iVar4 = (*PastElt->_vptr_EbmlElement[3])(PastElt);
    iVar2 = *(int *)CONCAT44(extraout_var,iVar4);
    lVar3 = *(long *)((int *)CONCAT44(extraout_var,iVar4) + 2);
    iVar4 = (*(this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar9]->_vptr_EbmlElement[3])();
    if ((*(long *)((int *)CONCAT44(extraout_var_00,iVar4) + 2) == lVar3) &&
       (*(int *)CONCAT44(extraout_var_00,iVar4) == iVar2)) break;
    ppEVar6 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar5 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = uVar9 + 1;
  }
  return (this->ElementList).
         super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl
         .super__Vector_impl_data._M_start[uVar9];
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      return ElementList[Index];
    Index++;
  }

  return NULL;
}